

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
* __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::operator++(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this)

{
  value_t vVar1;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  if (this->m_object != (pointer)0x0) {
    vVar1 = this->m_object->m_type;
    if (vVar1 == object) {
      std::
      advance<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,int>
                (&(this->m_it).object_iterator,1);
    }
    else if (vVar1 == array) {
      std::
      advance<__gnu_cxx::__normal_iterator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,int>
                (&(this->m_it).array_iterator,1);
    }
    else {
      primitive_iterator_t::operator++(&(this->m_it).primitive_iterator);
    }
    return this;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x1362,
                "iter_impl<BasicJsonType> &nlohmann::detail::iter_impl<nlohmann::basic_json<>>::operator++() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

iter_impl& operator++() {
		assert(m_object != nullptr);

		switch (m_object->m_type) {
			case value_t::object: {
				std::advance(m_it.object_iterator, 1);
				break;
			}

			case value_t::array: {
				std::advance(m_it.array_iterator, 1);
				break;
			}

			default: {
				++m_it.primitive_iterator;
				break;
			}
		}

		return *this;
	}